

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wait.cpp
# Opt level: O0

void sc_core::next_trigger(sc_event_and_list *el,sc_simcontext *simc)

{
  bool bVar1;
  sc_curr_proc_handle el_00;
  sc_method_process *in_RSI;
  sc_curr_proc_handle cpi;
  int in_stack_00000064;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  sc_severity in_stack_00000084;
  
  bVar1 = sc_event_list::empty((sc_event_list *)0x2d0b38);
  if (bVar1) {
    sc_report_handler::report
              (in_stack_00000084,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000064);
  }
  el_00 = sc_simcontext::get_curr_proc_info((sc_simcontext *)in_RSI);
  if (el_00->kind == SC_METHOD_PROC_) {
    sc_method_process::next_trigger(in_RSI,(sc_event_and_list *)el_00);
  }
  else {
    sc_report_handler::report
              (in_stack_00000084,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000064);
  }
  return;
}

Assistant:

SC_API void
next_trigger( const sc_event_and_list& el, sc_simcontext* simc )
{
    if( el.empty() ) {
        SC_REPORT_ERROR( SC_ID_EVENT_LIST_FAILED_,
                         "next_trigger() on empty event list not allowed" );
        // may continue, if suppressed
    }

    sc_curr_proc_handle cpi = simc->get_curr_proc_info();
    if( cpi->kind == SC_METHOD_PROC_ ) {
	reinterpret_cast<sc_method_handle>( cpi->process_handle )->next_trigger( el );
    } else {
	SC_REPORT_ERROR( SC_ID_NEXT_TRIGGER_NOT_ALLOWED_, "\n        "
			 "in SC_THREADs and SC_CTHREADs use wait() instead" );
    }
}